

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void create_decl(c2m_ctx_t c2m_ctx,node_t_conflict scope,node_t_conflict decl_node,
                decl_spec decl_spec,node_t_conflict initializer,int param_p)

{
  decl_spec *decl_spec_00;
  check_ctx *pcVar1;
  check_ctx *pcVar2;
  node_t pnVar3;
  int *piVar4;
  decl_spec dVar5;
  uint uVar6;
  int iVar7;
  decl_t pdVar8;
  type *ptVar9;
  node_t_conflict pnVar10;
  decl_t *__ptr;
  int *piVar11;
  char *pcVar12;
  long extraout_RDX;
  node_t r;
  decl_spec *pdVar13;
  FILE *__stream;
  decl_t member_decl;
  c2m_ctx_t c2m_ctx_00;
  node_code_t in_R9D;
  size_t sVar14;
  ulong uVar15;
  undefined8 uVar16;
  int *piVar17;
  int *piVar18;
  bool bVar19;
  pos_t pVar20;
  long lVar21;
  VARR_decl_t *pVVar22;
  int *local_70;
  node_t_conflict local_48;
  
  bVar19 = decl_node->code == N_FUNC_DEF;
  pcVar1 = c2m_ctx->check_ctx;
  pdVar8 = (decl_t)reg_malloc(c2m_ctx,0x60);
  uVar6 = decl_node->code - N_SPEC_DECL;
  if ((0x28 < uVar6) || ((0x10000800001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
    __assert_fail("decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL || decl_node->code == N_FUNC_DEF"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ec9,
                  "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
  }
  pcVar2 = c2m_ctx->check_ctx;
  *(byte *)pdVar8 = *(byte *)pdVar8 & 0xf0;
  r = (node_t_conflict)0x0;
  pdVar8->offset = 0;
  pdVar8->bit_offset = -1;
  pdVar8->param_args_start = 0;
  pdVar8->param_args_num = 0;
  pdVar8->containing_unnamed_anon_struct_union_member =
       pcVar2->curr_unnamed_anon_struct_union_member;
  (pdVar8->u).asm_str = (char *)0x0;
  pdVar8->c2m_ctx = c2m_ctx;
  pdVar8->scope = scope;
  *(undefined4 *)&(pdVar8->decl_spec).field_0x0 = decl_spec._0_4_;
  (pdVar8->decl_spec).align = decl_spec.align;
  (pdVar8->decl_spec).align_node = decl_spec.align_node;
  (pdVar8->decl_spec).linkage = decl_spec.linkage;
  *(undefined4 *)&(pdVar8->decl_spec).field_0x14 = decl_spec._20_4_;
  (pdVar8->decl_spec).type = decl_spec.type;
  decl_node->attr = pdVar8;
  pnVar3 = (decl_node->u).ops.head;
  if (pnVar3 != (node_t)0x0) {
    r = (pnVar3->op_link).next;
  }
  piVar11 = (int *)(ulong)bVar19;
  uVar6 = (uint)bVar19;
  if (r->code == N_DECL) {
    ptVar9 = check_declarator(c2m_ctx,r,uVar6);
    ptVar9 = append_type(ptVar9,(pdVar8->decl_spec).type);
    (pdVar8->decl_spec).type = ptVar9;
  }
  else {
    if (r->code != N_IGNORE) {
      __assert_fail("declarator->code == N_DECL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed3,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    if (decl_node->code != N_MEMBER) {
      __assert_fail("decl_node->code == N_MEMBER",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed0,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    (pdVar8->decl_spec).linkage = N_IGNORE;
    ptVar9 = (pdVar8->decl_spec).type;
  }
  decl_spec_00 = &pdVar8->decl_spec;
  local_70 = (int *)0x0;
  check_type(c2m_ctx,ptVar9,0,uVar6);
  if (r->code == N_DECL) {
    local_48 = (r->u).ops.head;
    if ((param_p == 0) && (pnVar3 = (((local_48->op_link).next)->u).ops.head, pnVar3 != (node_t)0x0)
       ) {
      local_70 = (int *)(ulong)(pnVar3->code == N_FUNC);
    }
    uVar15 = 0;
    dVar5 = *decl_spec_00;
    pnVar10 = find_def(c2m_ctx,S_REGULAR,local_48,scope,(node_t_conflict *)0x0);
    if ((undefined1  [32])((undefined1  [32])dVar5 & (undefined1  [32])0x1) == (undefined1  [32])0x0
       ) {
      if (((undefined1  [32])((undefined1  [32])dVar5 & (undefined1  [32])0x4) ==
           (undefined1  [32])0x0) || (c2m_ctx->top_scope != scope)) {
        if (((undefined1  [32])((undefined1  [32])dVar5 & (undefined1  [32])0x2) ==
             (undefined1  [32])0x0) || (pnVar10 == (node_t_conflict)0x0)) {
          if ((undefined1  [32])((undefined1  [32])dVar5 & (undefined1  [32])0x2) ==
              (undefined1  [32])0x0) {
            if (((undefined1  [32])((undefined1  [32])dVar5 & (undefined1  [32])0x4) !=
                 (undefined1  [32])0x0) ||
               ((uVar15 = 0x58, (int)local_70 == 0 && (c2m_ctx->top_scope != scope)))) {
LAB_00185de3:
              uVar15 = 0;
            }
          }
          else {
            uVar15 = 0x58;
            if ((pnVar10 != (node_t_conflict)0x0) && (*(int *)((long)pnVar10->attr + 0x38) != 0))
            goto LAB_00185de3;
          }
        }
        else {
          uVar6 = *(uint *)((long)pnVar10->attr + 0x38);
          uVar15 = 0x58;
          if (uVar6 != 0) {
            uVar15 = (ulong)uVar6;
          }
        }
      }
      else {
        uVar15 = 0x59;
      }
    }
    (pdVar8->decl_spec).linkage = (node_code_t)uVar15;
    uVar16 = CONCAT71((int7)(uVar15 >> 8),(int)local_70 == 0);
    piVar11 = local_70;
  }
  else {
    uVar16 = 1;
    local_48 = (node_t_conflict)0x0;
  }
  c2m_ctx_00 = (c2m_ctx_t)&(pdVar8->decl_spec).type;
  if (decl_node->code != N_MEMBER) {
    set_type_layout(c2m_ctx,*(type **)c2m_ctx_00);
    pdVar13 = decl_spec_00;
    check_decl_align(c2m_ctx,decl_spec_00);
    if ((((undefined1  [32])((undefined1  [32])*decl_spec_00 & (undefined1  [32])0x1) ==
          (undefined1  [32])0x0) && (pdVar8->scope != c2m_ctx->top_scope)) &&
       (pdVar8->scope->code != N_FUNC)) {
      pVVar22 = pcVar1->func_decls_for_allocation;
      __ptr = pVVar22->varr;
      if (__ptr == (decl_t *)0x0) {
        create_decl_cold_1();
        if (*piVar11 != 0) {
          if (*piVar11 != 0x54) {
            __assert_fail("attrs->code == N_LIST",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x20d1,"const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)")
            ;
          }
          piVar11 = *(int **)(piVar11 + 8);
          if (piVar11 != (int *)0x0) {
            piVar17 = (int *)0x0;
            lVar21 = extraout_RDX;
            do {
              if (*piVar11 != 0x80) {
                __assert_fail("n->code == N_ATTR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x20d4,
                              "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
              }
              piVar4 = *(int **)(piVar11 + 8);
              if (*piVar4 != 0x10) {
                __assert_fail("id->code == N_ID",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x20d6,
                              "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
              }
              iVar7 = strcmp(*(char **)(piVar4 + 8),"antialias");
              piVar18 = piVar17;
              if (iVar7 == 0) {
                if (**(int **)(piVar4 + 6) != 0x54) {
                  __assert_fail("list->code == N_LIST",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x20d9,
                                "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
                }
                piVar4 = *(int **)(*(int **)(piVar4 + 6) + 8);
                if (piVar4 != (int *)0x0) {
                  piVar18 = piVar4;
                  if (*(long *)(piVar4 + 6) == 0) {
                    if (*piVar4 == 0x10) {
                      if ((piVar17 != (int *)0x0) &&
                         (iVar7 = strcmp(*(char **)(piVar4 + 8),*(char **)(piVar17 + 8)), iVar7 != 0
                         )) {
                        pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                              (node_t_conflict)(ulong)(uint)pdVar13->align);
                        error(c2m_ctx_00,0x1c03f1,pVar20.fname,pVar20._8_8_,
                              *(undefined8 *)(piVar4 + 8),*(undefined8 *)(piVar17 + 8),lVar21,
                              c2m_ctx,initializer,uVar16,pVVar22,pdVar8,r);
                      }
                      goto LAB_00185f89;
                    }
                    pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                          (node_t_conflict)(ulong)(uint)pdVar13->align);
                    pcVar12 = "antialias attribute arg should be an identifier";
                  }
                  else {
                    pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                          (node_t_conflict)(ulong)(uint)pdVar13->align);
                    pcVar12 = "antialias attribute has more one arg";
                  }
                  error(c2m_ctx_00,pcVar12,pVar20.fname,pVar20._8_8_);
                }
              }
LAB_00185f89:
              piVar11 = *(int **)(piVar11 + 6);
              piVar17 = piVar18;
            } while (piVar11 != (int *)0x0);
            if ((piVar18 != (int *)0x0) && (*(int *)(*(long *)(lVar21 + 0x40) + 0x18) != 3)) {
              pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                    (node_t_conflict)(ulong)(uint)pdVar13->align);
              error(c2m_ctx_00,0x1c0423,pVar20.fname,pVar20._8_8_);
            }
          }
        }
        return;
      }
      sVar14 = pVVar22->els_num;
      uVar15 = sVar14 + 1;
      if (pVVar22->size < uVar15) {
        sVar14 = (uVar15 >> 1) + uVar15;
        __ptr = (decl_t *)realloc(__ptr,sVar14 * 8);
        pVVar22->varr = __ptr;
        pVVar22->size = sVar14;
        sVar14 = pVVar22->els_num;
        uVar15 = sVar14 + 1;
      }
      pVVar22->els_num = uVar15;
      __ptr[sVar14] = pdVar8;
    }
  }
  if (r->code == N_DECL) {
    def_symbol(c2m_ctx,(symbol_mode)local_48,scope,decl_node,
               (node_t_conflict)(ulong)(pdVar8->decl_spec).linkage,in_R9D);
    if ((c2m_ctx->top_scope != scope) && ((pdVar8->decl_spec).linkage == N_EXTERN)) {
      def_symbol(c2m_ctx,(symbol_mode)local_48,c2m_ctx->top_scope,decl_node,
                 (node_t_conflict)&DAT_00000058,in_R9D);
    }
    if (((char)uVar16 == '\0') &&
       ((undefined1  [32])((undefined1  [32])*decl_spec_00 & (undefined1  [32])0x20) !=
        (undefined1  [32])0x0)) {
      pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)local_48->uid
                           );
      error(c2m_ctx,0x1c007f,pVar20.fname,pVar20._8_8_);
      __stream = (FILE *)c2m_ctx->options->message_file;
      if (__stream != (FILE *)0x0) {
        if (local_48->code != N_IGNORE) {
          fprintf(__stream," of %s",(local_48->u).s.s);
          __stream = (FILE *)c2m_ctx->options->message_file;
        }
        fputc(10,__stream);
      }
    }
  }
  if ((initializer == (node_t_conflict)0x0) || (initializer->code == N_IGNORE)) {
    return;
  }
  ptVar9 = *(type **)c2m_ctx_00;
  iVar7 = incomplete_type_p(c2m_ctx,ptVar9);
  if (iVar7 == 0) {
LAB_00185cb4:
    if (((pdVar8->decl_spec).linkage == N_EXTERN) && (c2m_ctx->top_scope != scope)) {
      pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                            (node_t_conflict)(ulong)initializer->uid);
      error(c2m_ctx,0x1c00f3,pVar20.fname,pVar20._8_8_,(local_48->u).s.s);
      return;
    }
    member_decl = (decl_t)initializer;
    check(c2m_ctx,initializer,decl_node);
    uVar6 = 1;
    if ((((pdVar8->decl_spec).linkage & ~N_I) != N_EXTERN) && ((*(byte *)decl_spec_00 & 0x20) == 0))
    {
      uVar6 = *(byte *)decl_spec_00 >> 2 & 1;
    }
    check_initializer(c2m_ctx,member_decl,(type **)c2m_ctx_00,initializer,uVar6,1);
    return;
  }
  if (ptVar9->mode == TM_ARR) {
    ptVar9 = ((ptVar9->u).ptr_type)->arr_type;
    iVar7 = incomplete_type_p(c2m_ctx,ptVar9);
    if (iVar7 == 0) goto LAB_00185cb4;
    if (ptVar9->mode == TM_ARR) {
      pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                            (node_t_conflict)(ulong)initializer->uid);
      pcVar12 = "initialization of incomplete sub-array";
      goto LAB_00185d18;
    }
  }
  pVar20 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)initializer->uid)
  ;
  pcVar12 = "initialization of incomplete type variable";
LAB_00185d18:
  error(c2m_ctx,pcVar12,pVar20.fname,pVar20._8_8_);
  return;
}

Assistant:

static void create_decl (c2m_ctx_t c2m_ctx, node_t scope, node_t decl_node,
                         struct decl_spec decl_spec, node_t initializer, int param_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  int func_def_p = decl_node->code == N_FUNC_DEF, func_p = FALSE;
  node_t id = NULL; /* to remove an uninitialized warning */
  node_t list_head, declarator;
  struct type *type;
  decl_t decl = reg_malloc (c2m_ctx, sizeof (struct decl));

  assert (decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL
          || decl_node->code == N_FUNC_DEF);
  init_decl (c2m_ctx, decl);
  decl->scope = scope;
  decl->decl_spec = decl_spec;
  decl_node->attr = decl;
  declarator = NL_EL (decl_node->u.ops, 1);
  if (declarator->code == N_IGNORE) {
    assert (decl_node->code == N_MEMBER);
    decl->decl_spec.linkage = N_IGNORE;
  } else {
    assert (declarator->code == N_DECL);
    type = check_declarator (c2m_ctx, declarator, func_def_p);
    decl->decl_spec.type = append_type (type, decl->decl_spec.type);
  }
  check_type (c2m_ctx, decl->decl_spec.type, 0, func_def_p);
  if (declarator->code == N_DECL) {
    id = NL_HEAD (declarator->u.ops);
    list_head = NL_HEAD (NL_NEXT (id)->u.ops);
    func_p = !param_p && list_head && list_head->code == N_FUNC;
    decl->decl_spec.linkage = get_id_linkage (c2m_ctx, func_p, id, scope, decl->decl_spec);
  }
  if (decl_node->code != N_MEMBER) {
    set_type_layout (c2m_ctx, decl->decl_spec.type);
    check_decl_align (c2m_ctx, &decl->decl_spec);
    if (!decl->decl_spec.typedef_p && decl->scope != top_scope && decl->scope->code != N_FUNC)
      VARR_PUSH (decl_t, func_decls_for_allocation, decl);
  }
  if (declarator->code == N_DECL) {
    def_symbol (c2m_ctx, S_REGULAR, id, scope, decl_node, decl->decl_spec.linkage);
    if (scope != top_scope && decl->decl_spec.linkage == N_EXTERN)
      def_symbol (c2m_ctx, S_REGULAR, id, top_scope, decl_node, N_EXTERN);
    if (func_p && decl->decl_spec.thread_local_p) {
      error (c2m_ctx, POS (id), "thread local function declaration");
      if (c2m_options->message_file != NULL) {
        if (id->code != N_IGNORE) fprintf (c2m_options->message_file, " of %s", id->u.s.s);
        fprintf (c2m_options->message_file, "\n");
      }
    }
  }
  if (initializer == NULL || initializer->code == N_IGNORE) return;
  if (incomplete_type_p (c2m_ctx, decl->decl_spec.type)
      && (decl->decl_spec.type->mode != TM_ARR
          || incomplete_type_p (c2m_ctx, decl->decl_spec.type->u.arr_type->el_type))) {
    if (decl->decl_spec.type->mode == TM_ARR
        && decl->decl_spec.type->u.arr_type->el_type->mode == TM_ARR)
      error (c2m_ctx, POS (initializer), "initialization of incomplete sub-array");
    else
      error (c2m_ctx, POS (initializer), "initialization of incomplete type variable");
    return;
  }
  if (decl->decl_spec.linkage == N_EXTERN && scope != top_scope) {
    error (c2m_ctx, POS (initializer), "initialization of %s in block scope with external linkage",
           id->u.s.s);
    return;
  }
  check (c2m_ctx, initializer, decl_node);
  check_initializer (c2m_ctx, NULL, &decl->decl_spec.type, initializer,
                     decl->decl_spec.linkage == N_STATIC || decl->decl_spec.linkage == N_EXTERN
                       || decl->decl_spec.thread_local_p || decl->decl_spec.static_p,
                     TRUE);
}